

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::LabelTextV(char *label,char *fmt,__va_list_tag *args)

{
  bool bVar1;
  int iVar2;
  ImVec2 *align;
  char *value_text_end;
  char *value_text_begin;
  ImRect total_bb;
  ImRect value_bb;
  ImVec2 label_size;
  float w;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffee8;
  float fVar3;
  __va_list_tag *in_stack_fffffffffffffef0;
  char *fmt_00;
  size_t in_stack_ffffffffffffff00;
  ImRect *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  ImGuiID id;
  ImRect *in_stack_ffffffffffffff18;
  ImVec2 *this;
  undefined4 in_stack_ffffffffffffff28;
  float fVar4;
  undefined1 hide_text_after_hash;
  ImVec2 *this_00;
  ImVec2 *min;
  ImVec2 pos;
  undefined4 in_stack_ffffffffffffff50;
  float fVar5;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 *local_98;
  char *local_90;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImVec2 local_74;
  ImRect local_6c;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImRect local_4c;
  ImVec2 local_3c;
  float local_34;
  ImGuiStyle *local_30;
  ImGuiContext *local_28;
  ImGuiWindow *local_20;
  
  local_20 = GetCurrentWindow();
  if ((local_20->SkipItems & 1U) == 0) {
    local_28 = GImGui;
    local_30 = &GImGui->Style;
    local_34 = CalcItemWidth();
    local_3c = CalcTextSize((char *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                            SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0),
                            SUB84(in_stack_ffffffffffffff08,0));
    id = (ImGuiID)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    min = &(local_20->DC).CursorPos;
    fVar4 = (local_30->FramePadding).y;
    this_00 = &local_5c;
    ImVec2::ImVec2(this_00,local_34,fVar4 + fVar4 + local_3c.y);
    local_54 = operator+(in_stack_fffffffffffffee8,(ImVec2 *)0x1885ba);
    ImRect::ImRect(&local_4c,min,&local_54);
    pos = (ImVec2)&local_20->DC;
    if (local_3c.x <= 0.0) {
      fVar4 = 0.0;
    }
    else {
      fVar4 = (local_30->ItemInnerSpacing).x;
    }
    fVar3 = (local_30->FramePadding).y;
    this = &local_84;
    fVar5 = local_34;
    ImVec2::ImVec2(this,local_34 + fVar4,fVar3 + fVar3);
    local_7c = operator+(in_stack_fffffffffffffee8,(ImVec2 *)0x188685);
    local_74 = operator+(in_stack_fffffffffffffee8,(ImVec2 *)0x1886a3);
    fVar3 = (float)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    ImRect::ImRect(&local_6c,(ImVec2 *)pos,&local_74);
    ItemSize((ImRect *)in_stack_fffffffffffffef0,fVar3);
    bVar1 = ItemAdd(in_stack_ffffffffffffff18,id,in_stack_ffffffffffffff08);
    if (bVar1) {
      fmt_00 = local_28->TempBuffer;
      local_90 = fmt_00;
      iVar2 = ImFormatStringV((char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,fmt_00,
                              in_stack_fffffffffffffef0);
      align = (ImVec2 *)(fmt_00 + iVar2);
      local_98 = align;
      ImVec2::ImVec2(&local_a0,0.0,0.5);
      RenderTextClipped((ImVec2 *)pos,min,(char *)this_00,
                        (char *)CONCAT44(fVar4,in_stack_ffffffffffffff28),this,align,
                        (ImRect *)CONCAT44(fVar5,in_stack_ffffffffffffff50));
      hide_text_after_hash = (undefined1)((uint)fVar4 >> 0x18);
      if (0.0 < local_3c.x) {
        ImVec2::ImVec2(&local_a8,local_4c.Max.x + (local_30->ItemInnerSpacing).x,
                       local_4c.Min.y + (local_30->FramePadding).y);
        RenderText(pos,(char *)min,(char *)this_00,(bool)hide_text_after_hash);
      }
    }
  }
  return;
}

Assistant:

void ImGui::LabelTextV(const char* label, const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const float w = CalcItemWidth();

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect value_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2));
    const ImRect total_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w + (label_size.x > 0.0f ? style.ItemInnerSpacing.x : 0.0f), style.FramePadding.y * 2) + label_size);
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0))
        return;

    // Render
    const char* value_text_begin = &g.TempBuffer[0];
    const char* value_text_end = value_text_begin + ImFormatStringV(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), fmt, args);
    RenderTextClipped(value_bb.Min, value_bb.Max, value_text_begin, value_text_end, NULL, ImVec2(0.0f, 0.5f));
    if (label_size.x > 0.0f)
        RenderText(ImVec2(value_bb.Max.x + style.ItemInnerSpacing.x, value_bb.Min.y + style.FramePadding.y), label);
}